

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

HierarchicalReference * __thiscall
slang::BumpAllocator::emplace<slang::ast::HierarchicalReference,slang::ast::HierarchicalReference&>
          (BumpAllocator *this,HierarchicalReference *args)

{
  Symbol *pSVar1;
  Expression *pEVar2;
  size_t sVar3;
  HierarchicalReference *pHVar4;
  
  pHVar4 = (HierarchicalReference *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((HierarchicalReference *)this->endPtr < pHVar4 + 1) {
    pHVar4 = (HierarchicalReference *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pHVar4 + 1);
  }
  pHVar4->upwardCount = args->upwardCount;
  pSVar1 = args->target;
  pEVar2 = args->expr;
  sVar3 = (args->path)._M_extent._M_extent_value;
  (pHVar4->path)._M_ptr = (args->path)._M_ptr;
  (pHVar4->path)._M_extent._M_extent_value = sVar3;
  pHVar4->target = pSVar1;
  pHVar4->expr = pEVar2;
  return pHVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }